

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

void __thiscall tcu::Matrix<tcu::Interval,_2,_4>::Matrix(Matrix<tcu::Interval,_2,_4> *this)

{
  bool *pbVar1;
  undefined8 *puVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  undefined4 local_e;
  undefined3 uStack_a;
  undefined4 local_7;
  undefined3 uStack_3;
  
  lVar5 = 0x20;
  do {
    *(undefined1 *)((long)(this->m_data).m_data[0].m_data + lVar5 + -0x20) = 0;
    puVar2 = (undefined8 *)((long)((this->m_data).m_data[0].m_data + -1) + lVar5);
    *puVar2 = 0x7ff0000000000000;
    puVar2[1] = 0xfff0000000000000;
    *(undefined1 *)((long)(this->m_data).m_data[0].m_data + lVar5 + -8) = 0;
    pbVar1 = &(this->m_data).m_data[0].m_data[0].m_hasNaN + lVar5;
    *(undefined8 *)pbVar1 = 0x7ff0000000000000;
    *(double *)(pbVar1 + 8) = -INFINITY;
    lVar5 = lVar5 + 0x30;
  } while (lVar5 != 0xe0);
  lVar5 = 0x20;
  do {
    *(undefined1 *)((long)(this->m_data).m_data[0].m_data + lVar5 + -0x20) = 0;
    *(undefined4 *)((long)(this->m_data).m_data[0].m_data + lVar5 + -0x1f) = local_7;
    *(uint *)((long)(this->m_data).m_data[0].m_data + lVar5 + -0x1c) =
         CONCAT31(uStack_3,local_7._3_1_);
    puVar2 = (undefined8 *)((long)((this->m_data).m_data[0].m_data + -1) + lVar5);
    *puVar2 = 0x7ff0000000000000;
    puVar2[1] = 0xfff0000000000000;
    *(undefined1 *)((long)(this->m_data).m_data[0].m_data + lVar5 + -8) = 0;
    *(undefined4 *)((long)(this->m_data).m_data[0].m_data + lVar5 + -7) = local_e;
    *(uint *)((long)(this->m_data).m_data[0].m_data + lVar5 + -4) = CONCAT31(uStack_a,local_e._3_1_)
    ;
    pbVar1 = &(this->m_data).m_data[0].m_data[0].m_hasNaN + lVar5;
    *(undefined8 *)pbVar1 = 0x7ff0000000000000;
    *(double *)(pbVar1 + 8) = -INFINITY;
    lVar5 = lVar5 + 0x30;
  } while (lVar5 != 0xe0);
  lVar5 = 0;
  bVar3 = true;
  do {
    bVar4 = bVar3;
    lVar6 = 0;
    do {
      uVar7 = 0x3ff00000;
      if (lVar5 * 0x30 != lVar6) {
        uVar7 = 0;
      }
      (&(this->m_data).m_data[0].m_data[lVar5].m_hasNaN)[lVar6] = false;
      *(ulong *)((long)&(this->m_data).m_data[0].m_data[lVar5].m_lo + lVar6) = (ulong)uVar7 << 0x20;
      *(ulong *)((long)&(this->m_data).m_data[0].m_data[lVar5].m_hi + lVar6) = (ulong)uVar7 << 0x20;
      lVar6 = lVar6 + 0x30;
    } while (lVar6 != 0xc0);
    lVar5 = 1;
    bVar3 = false;
  } while (bVar4);
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (void)
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = (row == col) ? T(1) : T(0);
}